

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QRect>::resize(QList<QRect> *this,qsizetype size)

{
  undefined8 *puVar1;
  Data *pDVar2;
  QRect *pQVar3;
  long lVar4;
  
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) <
      size)) {
    QArrayDataPointer<QRect>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QRect **)0x0,
               (QArrayDataPointer<QRect> *)0x0);
    lVar4 = (this->d).size;
  }
  else {
    lVar4 = (this->d).size;
    if (size < lVar4) goto LAB_0042f45c;
  }
  if (size <= lVar4) {
    return;
  }
  pQVar3 = (this->d).ptr;
  lVar4 = lVar4 << 4;
  do {
    puVar1 = (undefined8 *)((long)&(pQVar3->x1).m_i + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x10;
  } while (size << 4 != lVar4);
LAB_0042f45c:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }